

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O3

void __thiscall cali::Caliper::activate_channel(Caliper *this,Channel *channel)

{
  __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
  _Var1;
  Channel *pCVar2;
  ulong uVar3;
  GlobalData *pGVar4;
  
  ((channel->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  is_active = true;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<cali::Channel*,std::vector<cali::Channel,std::allocator<cali::Channel>>>,__gnu_cxx::__ops::_Iter_equals_val<cali::Channel_const>>
                    ((this->sG->active_channels).
                     super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->sG->active_channels).
                     super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                     super__Vector_impl_data._M_finish,channel);
  pGVar4 = this->sG;
  pCVar2 = (pGVar4->active_channels).
           super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (_Var1._M_current == pCVar2) {
    std::vector<cali::Channel,std::allocator<cali::Channel>>::emplace_back<cali::Channel&>
              ((vector<cali::Channel,std::allocator<cali::Channel>> *)&pGVar4->active_channels,
               channel);
    pGVar4 = this->sG;
    pCVar2 = (pGVar4->active_channels).
             super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  uVar3 = (long)pCVar2 -
          (long)(pGVar4->active_channels).
                super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                super__Vector_impl_data._M_start >> 4;
  if (uVar3 < pGVar4->max_active_channels) {
    uVar3 = pGVar4->max_active_channels;
  }
  pGVar4->max_active_channels = uVar3;
  return;
}

Assistant:

void Caliper::activate_channel(Channel& channel)
{
    channel.mP->is_active = true;

    auto it = std::find(sG->active_channels.begin(), sG->active_channels.end(), channel);
    if (it == sG->active_channels.end())
        sG->active_channels.emplace_back(channel);

    sG->max_active_channels = std::max(sG->max_active_channels, sG->active_channels.size());
}